

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void __thiscall
embree::TutorialBuildBenchmark::registerBuildBenchmark
          (TutorialBuildBenchmark *this,string *name,BuildBenchType buildBenchType,int argc,
          char **argv)

{
  BuildBenchType BVar1;
  BuildBenchParams *pBVar2;
  ostream *poVar3;
  BuildBenchParams BVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_type __dnew;
  BenchState benchState;
  BuildBenchParams p;
  long local_78;
  BenchState local_70;
  long local_68;
  long local_60 [2];
  BuildBenchParams local_50;
  BuildBenchParams local_48;
  long local_40;
  BuildBenchParams BStack_38;
  
  BVar1 = (this->buildParams).buildBenchType;
  if ((BVar1 & buildBenchType) == 0) {
    return;
  }
  if ((BVar1 & BVar1 - UPDATE_DYNAMIC_DEFORMABLE) == 0) goto LAB_0024c4da;
  local_70.state = (State *)local_60;
  if (0x1f < (int)buildBenchType) {
    if ((int)buildBenchType < 0x80) {
      if (buildBenchType == CREATE_DYNAMIC_STATIC) {
        local_78 = 0x15;
        local_70.state =
             (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
        uVar7._0_1_ = 'c';
        uVar7._1_1_ = 'r';
        uVar7._2_1_ = 'e';
        uVar7._3_1_ = 'a';
        goto LAB_0024c3e7;
      }
      if (buildBenchType != CREATE_STATIC_STATIC) goto switchD_0024c1c8_caseD_3;
      local_78 = 0x14;
      local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78)
      ;
      local_60[0] = local_78;
      *(undefined8 *)local_70.state = 0x735f657461657263;
      *(undefined8 *)(local_70.state + 8) = 0x74735f6369746174;
      *(undefined4 *)(local_70.state + 0x10) = 0x63697461;
    }
    else {
      if (buildBenchType == CREATE_HIGH_QUALITY_STATIC_STATIC) {
        local_78 = 0x21;
        local_70.state =
             (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
        *(undefined8 *)local_70.state = 0x685f657461657263;
        *(undefined8 *)(local_70.state + 8) = 0x6c6175715f686769;
        uVar8._0_1_ = 'i';
        uVar8._1_1_ = 't';
        uVar8._2_1_ = 'y';
        uVar8._3_1_ = '_';
      }
      else {
        if (buildBenchType != CREATE_USER_THREADS_STATIC_STATIC) goto switchD_0024c1c8_caseD_3;
        local_78 = 0x21;
        local_70.state =
             (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
        *(undefined8 *)local_70.state = 0x755f657461657263;
        *(undefined8 *)(local_70.state + 8) = 0x657268745f726573;
        uVar8._0_1_ = 'a';
        uVar8._1_1_ = 'd';
        uVar8._2_1_ = 's';
        uVar8._3_1_ = '_';
      }
      *(undefined4 *)(local_70.state + 0x10) = uVar8;
      *(undefined4 *)(local_70.state + 0x14) = 0x74617473;
      *(undefined4 *)(local_70.state + 0x18) = 0x735f6369;
      *(undefined4 *)(local_70.state + 0x1c) = 0x69746174;
      local_70.state[0x20] = (State)0x63;
      local_60[0] = local_78;
    }
    goto LAB_0024c446;
  }
  switch(buildBenchType) {
  case UPDATE_DYNAMIC_DEFORMABLE:
    local_78 = 0x19;
    local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
    *(undefined8 *)(local_70.state + 9) = 0x65645f63696d616e;
    *(undefined8 *)(local_70.state + 0x11) = 0x656c62616d726f66;
    uVar5._0_1_ = 'u';
    uVar5._1_1_ = 'p';
    uVar5._2_1_ = 'd';
    uVar5._3_1_ = 'a';
    break;
  case UPDATE_DYNAMIC_DYNAMIC:
    local_78 = 0x16;
    local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
    uVar6._0_1_ = 'u';
    uVar6._1_1_ = 'p';
    uVar6._2_1_ = 'd';
    uVar6._3_1_ = 'a';
    goto LAB_0024c376;
  case UPDATE_DYNAMIC_DYNAMIC|UPDATE_DYNAMIC_DEFORMABLE:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DEFORMABLE:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DYNAMIC:
  case UPDATE_DYNAMIC_STATIC|UPDATE_DYNAMIC_DYNAMIC|UPDATE_DYNAMIC_DEFORMABLE:
switchD_0024c1c8_caseD_3:
    local_68 = 3;
    local_60[0] = CONCAT44(local_60[0]._4_4_,0x6c6c61);
    goto LAB_0024c44a;
  case UPDATE_DYNAMIC_STATIC:
    local_78 = 0x15;
    local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
    uVar7._0_1_ = 'u';
    uVar7._1_1_ = 'p';
    uVar7._2_1_ = 'd';
    uVar7._3_1_ = 'a';
LAB_0024c3e7:
    *(undefined4 *)local_70.state = uVar7;
    *(undefined4 *)(local_70.state + 4) = 0x645f6574;
    *(undefined4 *)(local_70.state + 8) = 0x6d616e79;
    *(undefined4 *)(local_70.state + 0xc) = 0x735f6369;
    *(undefined8 *)(local_70.state + 0xd) = 0x6369746174735f63;
    local_60[0] = local_78;
    goto LAB_0024c446;
  case CREATE_DYNAMIC_DEFORMABLE:
    local_78 = 0x19;
    local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
    *(undefined8 *)(local_70.state + 9) = 0x65645f63696d616e;
    *(undefined8 *)(local_70.state + 0x11) = 0x656c62616d726f66;
    uVar5._0_1_ = 'c';
    uVar5._1_1_ = 'r';
    uVar5._2_1_ = 'e';
    uVar5._3_1_ = 'a';
    break;
  default:
    if (buildBenchType != CREATE_DYNAMIC_DYNAMIC) goto switchD_0024c1c8_caseD_3;
    local_78 = 0x16;
    local_70.state = (State *)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_78);
    uVar6._0_1_ = 'c';
    uVar6._1_1_ = 'r';
    uVar6._2_1_ = 'e';
    uVar6._3_1_ = 'a';
LAB_0024c376:
    *(undefined4 *)local_70.state = uVar6;
    *(undefined4 *)(local_70.state + 4) = 0x645f6574;
    *(undefined4 *)(local_70.state + 8) = 0x6d616e79;
    *(undefined4 *)(local_70.state + 0xc) = 0x645f6369;
    *(undefined8 *)(local_70.state + 0xe) = 0x63696d616e79645f;
    local_60[0] = local_78;
    goto LAB_0024c446;
  }
  *(undefined4 *)local_70.state = uVar5;
  *(undefined4 *)(local_70.state + 4) = 0x645f6574;
  *(undefined4 *)(local_70.state + 8) = 0x6d616e79;
  *(undefined4 *)(local_70.state + 0xc) = 0x645f6369;
  local_60[0] = local_78;
LAB_0024c446:
  local_70.state[local_60[0]] = (State)0x0;
  local_78 = local_60[0];
  local_68 = local_60[0];
LAB_0024c44a:
  pBVar2 = (BuildBenchParams *)
           std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2564f6);
  BVar4 = (BuildBenchParams)(pBVar2 + 2);
  if (*pBVar2 == BVar4) {
    local_40 = *(long *)BVar4;
    BStack_38 = pBVar2[3];
    local_50 = (BuildBenchParams)&local_40;
  }
  else {
    local_40 = *(long *)BVar4;
    local_50 = *pBVar2;
  }
  local_48 = pBVar2[1];
  *pBVar2 = BVar4;
  pBVar2[1].buildBenchType = 0;
  pBVar2[1].userThreads = 0;
  *(undefined1 *)&pBVar2[2].buildBenchType = 0;
  std::__cxx11::string::_M_append((char *)name,(ulong)local_50);
  if (local_50 != (BuildBenchParams)&local_40) {
    operator_delete((void *)local_50);
  }
  if (local_70.state != (State *)local_60) {
    operator_delete(local_70.state);
  }
LAB_0024c4da:
  local_50.userThreads = (this->buildParams).userThreads;
  local_50.buildBenchType = buildBenchType;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BENCHMARK SCENE: ",0x11)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  (*this->buildBenchFunc)(&local_70,&(this->super_TutorialBenchmark).params,&local_50,argc,argv);
  return;
}

Assistant:

void TutorialBuildBenchmark::registerBuildBenchmark(std::string name, BuildBenchType buildBenchType, int argc, char** argv)
{
  if (buildParams.buildBenchType & buildBenchType) {
    // attach benchmark name if more than one bit in buildBenchMask is set
    bool attach = (buildParams.buildBenchType & (buildParams.buildBenchType - 1)) != 0;
    if (attach) name += "_" + getBuildBenchTypeString(buildBenchType);
    BuildBenchParams p = buildParams;
    p.buildBenchType = buildBenchType;
#ifdef USE_GOOGLE_BENCHMARK
    if (params.legacy) {
      std::cout << "BENCHMARK SCENE: " << name << std::endl;
      BenchState benchState;
      buildBenchFunc(benchState, params, p, argc, argv);
    }
    else {
      ::benchmark::RegisterBenchmark(name.c_str(), callBuildBenchFunc, argc, argv, params, p, buildBenchFunc)->Unit(::benchmark::TimeUnit::kMillisecond);
    }
#else
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    buildBenchFunc(benchState, params, p, argc, argv);
#endif
  }
}